

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O2

int starma(int ip,int iq,double *phi,double *theta,double *A,double *P,double *V)

{
  size_t __size;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  uint uVar5;
  void *__ptr;
  void *__ptr_00;
  void *__ptr_01;
  void *__ptr_02;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  double *pdVar13;
  ulong uVar14;
  void *pvVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  int iVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  int iVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  long local_68;
  int local_44;
  long local_40;
  int local_34;
  
  uVar5 = (uint)ip >> 0x1f;
  if (iq < 0) {
    uVar5 = 2;
  }
  uVar27 = 4;
  if (iq * iq != 0 || ip * ip != 0) {
    uVar27 = uVar5;
  }
  uVar16 = (ulong)(iq + 1U);
  if ((int)(iq + 1U) <= ip) {
    uVar16 = (ulong)(uint)ip;
  }
  iVar19 = (int)uVar16;
  uVar7 = (long)((iVar19 + 1) * iVar19) / 2;
  uVar8 = uVar7 & 0xffffffff;
  iVar21 = (int)uVar7;
  uVar26 = iVar21 - 1;
  uVar28 = (int)(uVar26 * iVar21) / 2;
  uVar5 = 8;
  if (iVar19 != 1) {
    uVar5 = uVar27;
  }
  if (uVar5 == 0) {
    lVar12 = (long)iVar21;
    __size = lVar12 * 8;
    __ptr = malloc(__size);
    __ptr_00 = malloc(__size);
    __ptr_01 = malloc(__size);
    __ptr_02 = malloc((long)(int)uVar28 << 3);
    lVar6 = (long)iVar19;
    for (lVar20 = 1; lVar20 < lVar6; lVar20 = lVar20 + 1) {
      A[lVar20] = 0.0;
      if (ip <= lVar20) {
        phi[lVar20] = 0.0;
      }
      V[lVar20] = 0.0;
      if (lVar20 <= iq) {
        V[lVar20] = theta[lVar20 + -1];
      }
    }
    *A = 0.0;
    if (ip == 0) {
      *phi = 0.0;
    }
    *V = 1.0;
    uVar7 = uVar16;
    pdVar13 = V;
    for (lVar20 = 1; pdVar13 = pdVar13 + 1, lVar20 < lVar6; lVar20 = lVar20 + 1) {
      dVar30 = V[lVar20];
      for (lVar22 = 0; lVar20 + lVar22 < lVar6; lVar22 = lVar22 + 1) {
        V[(int)uVar7 + lVar22] = pdVar13[lVar22] * dVar30;
      }
      uVar7 = (ulong)(uint)((int)uVar7 + (int)lVar22);
    }
    if (ip == 0) {
      iVar18 = -1;
      uVar16 = uVar8;
      for (iVar21 = 1; iVar21 != iVar19 + 1; iVar21 = iVar21 + 1) {
        iVar17 = (int)uVar8;
        for (lVar20 = 0; iVar25 = (int)lVar20, iVar18 != iVar25; lVar20 = lVar20 + -1) {
          dVar30 = V[(long)iVar17 + lVar20 + -1];
          P[(long)iVar17 + lVar20 + -1] = dVar30;
          if (iVar25 != 0) {
            iVar25 = (int)uVar16;
            uVar16 = (ulong)(iVar25 - 1);
            P[(long)iVar17 + lVar20 + -1] = dVar30 + P[(long)iVar25 + -1];
          }
        }
        uVar8 = (ulong)(uint)(iVar17 + iVar25);
        iVar18 = iVar18 + -1;
      }
    }
    else {
      uVar7 = 0;
      uVar14 = 0;
      if (0 < (int)uVar28) {
        uVar14 = (ulong)uVar28;
      }
      for (; uVar14 != uVar7; uVar7 = uVar7 + 1) {
        *(undefined8 *)((long)__ptr_02 + uVar7 * 8) = 0;
      }
      uVar14 = 0;
      uVar7 = 0;
      if (0 < iVar21) {
        uVar7 = uVar8;
      }
      for (; uVar7 != uVar14; uVar14 = uVar14 + 1) {
        P[uVar14] = 0.0;
        *(undefined8 *)((long)__ptr_00 + uVar14 * 8) = 0;
        *(undefined8 *)((long)__ptr + uVar14 * 8) = 0;
      }
      iVar17 = iVar21 - iVar19;
      uVar14 = (ulong)(iVar19 - 1);
      lVar20 = (long)iVar17;
      iVar18 = iVar17 + -1;
      uVar8 = 0;
      if (0 < iVar19) {
        uVar8 = uVar16;
      }
      local_44 = -1;
      local_40 = 0;
      local_68 = lVar20;
      for (uVar11 = 0; uVar11 != uVar8; uVar11 = uVar11 + 1) {
        dVar30 = phi[uVar11];
        *(undefined8 *)((long)__ptr + local_68 * 8) = 0;
        local_68 = local_68 + 1;
        local_40 = (long)(int)local_40;
        local_34 = iVar17 + 1 + (int)uVar11;
        for (uVar24 = uVar11; uVar24 != uVar16; uVar24 = uVar24 + 1) {
          dVar29 = phi[uVar24];
          lVar6 = (long)local_34;
          if ((uVar11 != uVar14) &&
             (*(double *)((long)__ptr + local_68 * 8) = -dVar29, uVar24 != uVar14)) {
            *(double *)((long)__ptr + lVar6 * 8) = *(double *)((long)__ptr + lVar6 * 8) - dVar30;
            lVar22 = (long)local_44;
            local_44 = local_44 + 1;
            *(undefined8 *)((long)__ptr + lVar22 * 8 + 8) = 0xbff0000000000000;
          }
          dVar31 = V[local_40];
          local_40 = local_40 + 1;
          *(double *)((long)__ptr + lVar20 * 8) = -dVar29 * dVar30;
          iVar18 = iVar18 + 1;
          if (iVar21 <= iVar18) {
            iVar18 = 0;
          }
          lVar22 = (long)iVar18;
          *(double *)((long)__ptr + lVar22 * 8) = *(double *)((long)__ptr + lVar22 * 8) + 1.0;
          for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
            *(undefined8 *)((long)__ptr_01 + uVar9 * 8) = *(undefined8 *)((long)__ptr + uVar9 * 8);
          }
          dVar29 = 1.0;
          iVar19 = 0;
          uVar9 = (ulong)uVar26;
          pvVar15 = __ptr_01;
          for (uVar10 = 0; pvVar15 = (void *)((long)pvVar15 + 8), uVar10 != uVar7;
              uVar10 = uVar10 + 1) {
            dVar1 = *(double *)((long)__ptr_01 + uVar10 * 8);
            if ((dVar1 != 0.0) || (NAN(dVar1))) {
              dVar2 = P[uVar10];
              dVar33 = dVar29 * dVar1 * dVar1 + dVar2;
              P[uVar10] = dVar33;
              dVar32 = dVar2 / dVar33;
              dVar33 = (dVar29 * dVar1) / dVar33;
              if (uVar10 != uVar26) {
                for (uVar23 = 0; uVar9 != uVar23; uVar23 = uVar23 + 1) {
                  dVar3 = *(double *)((long)pvVar15 + uVar23 * 8);
                  dVar4 = *(double *)((long)__ptr_02 + uVar23 * 8 + (long)iVar19 * 8);
                  *(double *)((long)pvVar15 + uVar23 * 8) = -dVar1 * dVar4 + dVar3;
                  *(double *)((long)__ptr_02 + uVar23 * 8 + (long)iVar19 * 8) =
                       dVar4 * dVar32 + dVar3 * dVar33;
                }
                iVar19 = iVar19 + (int)uVar23;
              }
              dVar3 = *(double *)((long)__ptr_00 + uVar10 * 8);
              *(double *)((long)__ptr_00 + uVar10 * 8) = dVar32 * dVar3 + dVar33 * dVar31;
              if ((dVar2 == 0.0) && (!NAN(dVar2))) goto LAB_00111867;
              dVar29 = dVar29 * dVar32;
              dVar31 = dVar31 + -dVar1 * dVar3;
            }
            else {
              iVar19 = iVar19 + iVar21 + ~(uint)uVar10;
            }
            uVar9 = uVar9 - 1;
          }
          if (dVar29 < 0.0) {
            sqrt(dVar29);
          }
LAB_00111867:
          *(undefined8 *)((long)__ptr + lVar22 * 8) = 0;
          if (uVar24 != uVar14) {
            *(undefined8 *)((long)__ptr + lVar6 * 8) = 0;
            local_34 = local_34 + 1;
            *(undefined8 *)((long)__ptr + (long)local_44 * 8) = 0;
          }
        }
      }
      iVar18 = uVar28 - 1;
      iVar19 = 0;
      lVar6 = (long)(int)uVar26;
      for (iVar21 = 0; iVar21 != (int)uVar7; iVar21 = iVar21 + 1) {
        dVar30 = *(double *)((long)__ptr_00 + lVar6 * 8);
        if (lVar6 != (int)uVar26) {
          for (lVar22 = 0; iVar19 != (int)lVar22; lVar22 = lVar22 + -1) {
            dVar30 = dVar30 - *(double *)((long)__ptr_02 + lVar22 * 8 + (long)iVar18 * 8) *
                              P[lVar12 + lVar22 + -1];
          }
          iVar18 = iVar18 + iVar19;
        }
        P[lVar6] = dVar30;
        lVar6 = lVar6 + -1;
        iVar19 = iVar19 + -1;
      }
      for (uVar16 = 0; uVar8 != uVar16; uVar16 = uVar16 + 1) {
        *(double *)((long)__ptr + uVar16 * 8) = P[lVar20 + uVar16];
      }
      lVar6 = 0;
      iVar19 = 0;
      if (0 < iVar17) {
        iVar19 = iVar17;
      }
      for (; -iVar19 != (int)lVar6; lVar6 = lVar6 + -1) {
        P[lVar12 + lVar6 + -1] = P[lVar20 + lVar6 + -1];
      }
      for (uVar16 = 0; uVar8 != uVar16; uVar16 = uVar16 + 1) {
        P[uVar16] = *(double *)((long)__ptr + uVar16 * 8);
      }
    }
    free(__ptr);
    free(__ptr_00);
    free(__ptr_01);
    free(__ptr_02);
  }
  return uVar5;
}

Assistant:

int starma(int ip, int iq,double *phi,double *theta,double *A,double *P,double *V) {
	int ifault,ir,np,nrbar,i,ind,j,ir1,irank,ifail;
	int npr, npr1, ind1, ind2, indj,indi,indn;
	double vj,ssqerr,phij,phii,ynext,weight,recres;
	double *thetab, *xnext, *xrow, *rbar;
	ifault = 0;
	/*
	c   algorithm as 154 appl. statist. (1980) vol.29, no.3
	c
	c   invoking this subroutine sets the values of v and phi, and obtains
	c   the initial values of a and p.
	c   this routine is not suitable for use with an ar(1) process.
	c   in this case the following instructions should be used for
	c   initialisation.
	c          v(1)=1.0
	c          a(1)=0.0
	c          p(1)=1.0/(1.0-phi(1)*phi(1))
	c
	*/

	// Check for input errors

	if (ip < 0) {
		ifault = 1;
	}
	if (iq < 0) {
		ifault = 2;
	}

	if (ip*ip + iq*iq == 0) {
		ifault = 4;
	}

	ir = iq + 1;

	if (ir < ip) {
		ir = ip;
	}

	np = (ir * (ir + 1)) / 2;
	nrbar = (np * (np - 1)) / 2;

	if (ir == 1) {
		ifault = 8;
	}
	
	if (ifault != 0) {
		return ifault;
	}

	xnext = (double*)malloc(sizeof(double)* np);
	thetab = (double*)malloc(sizeof(double)* np);
	xrow = (double*)malloc(sizeof(double)* np);
	rbar = (double*)malloc(sizeof(double)* nrbar);

	for (i = 1; i < ir;++i) {
		A[i] = 0.0;
		if (i >= ip) {
			phi[i] = 0.0;
		}
		V[i] = 0.0;
		if (i < iq+1) {
			V[i] = theta[i - 1];
		}
	}

	A[0] = 0.0;
	if (ip == 0) {
		phi[0] = 0.0;
	}
	V[0] = 1.0;
	ind = ir;

	for (j = 1; j < ir; ++j) {
		vj = V[j];
		for (i = j; i < ir; ++i) {
			V[ind] = V[i] * vj;
			ind++;
		}
	}

	if (ip != 0) {//300
		/*
		c   now find p(0).

c   the set of equations s*vec(p(0))=vec(v) is solved for vec(p(0)).
c   s is generated row by row in the array xnext.
c   the order of elements in p is changed, so as to bring more leading
c   zeros into the rows of s, hence achieving a reduction of computing
c   time.
		*/
		ir1 = ir - 1;
		irank = 0;
		ifail = 0;
		ssqerr = 0.0;

		for (i = 0; i < nrbar; ++i) {
			rbar[i] = 0.0;
		}
		for (i = 0; i < np; ++i) {
			P[i] = 0.0;
			thetab[i] = 0.0;
			xnext[i] = 0.0;
		}
		ind = 0;
		ind1 = -1;
		npr = np - ir;
		npr1 = npr + 1;
		indj = npr;
		ind2 = npr-1;

		for (j = 0; j < ir; ++j) {//110
			phij = phi[j];
			xnext[indj] = 0.0;
			indj = indj + 1;
			indi = npr1 + j;

			for (i = j; i < ir; ++i) {//110
				ynext = V[ind];
				ind++;
				phii = phi[i];
				if (j != (ir - 1)) {
					xnext[indj] = -phii;
					if (i != (ir - 1)) {
						xnext[indi] -= phij;
						ind1 ++;
						xnext[ind1] = -1.0;
					}
				}//100
				xnext[npr] = -phii*phij;
				ind2++;
				if (ind2 >= np) {
					ind2 = 0;
				}
				xnext[ind2] += 1.0;
				weight = 1.0;
				ifail = inclu2(np, nrbar, weight, xnext, xrow, ynext, P, rbar, thetab, &ssqerr, &recres, &irank);
				//mdisplay(P, 1, np);
				xnext[ind2] = 0.0;
				if (i != (ir - 1)) {
					xnext[indi] = 0.0;
					indi++;
					xnext[ind1] = 0.0;
				}
			}//110
		}//110
		//mdisplay(P, 1, np);
		regres(np, nrbar, rbar, thetab, P);
		/*
		Now Re-order P
		*/
		ind = npr;
		for (i = 0; i < ir; ++i) {
			ind++;
			xnext[i] = P[ind - 1];
		}
		ind = np;
		ind1 = npr;

		for (i = 0; i < npr; ++i) {
			P[ind - 1] = P[ind1 - 1];
			ind--;
			ind1--;
		}

		for (i = 0; i < ir; ++i) {
			P[i] = xnext[i];
		}
		//return ifault;
	}
	else {

		// P[0] is obtained by back-substitution for a Moving Average process

		indn = np;
		ind = np;
		for (i = 0; i < ir; i++) {
			for (j = 0; j <= i; j++) {
				ind--;
				P[ind] = V[ind];
				if (j != 0)  {
					indn--;
					P[ind] += P[indn];
				}
			}
		}
	}

	free(xnext);
	free(thetab);
	free(xrow);
	free(rbar);
	return ifault;
}